

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O0

void ast::Sections::binary_raw
               (char *file_name,uint word_size,uint byte_order,uint lower_address,
               uint higher_address)

{
  failure *e;
  uint32_t local_230;
  uint8_t c;
  uint address;
  undefined1 local_220 [8];
  ofstream file;
  uint higher_address_local;
  uint lower_address_local;
  uint byte_order_local;
  uint word_size_local;
  char *file_name_local;
  
  std::ofstream::ofstream(local_220,file_name,0x10);
  for (local_230 = lower_address + byte_order; local_230 < higher_address;
      local_230 = word_size + local_230) {
    Memory_space::read8((Memory_space *)memory,local_230);
    std::ostream::put((char)local_220);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void Sections::binary_raw(const char *file_name,
								unsigned word_size, unsigned byte_order,
								unsigned lower_address, unsigned higher_address) {
	try {
		std::ofstream file(file_name);
		for (auto address = lower_address + byte_order; address < higher_address; ) {
			uint8_t c = memory.read8(address);
			file.put(c);
			address += word_size;
		}
		file.close();
	} catch (ios_base::failure &e) {
		cerr << e.what();
	}
}